

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

int session_get_incoming_window(SESSION_HANDLE session,uint32_t *incoming_window)

{
  int iVar1;
  
  iVar1 = 1000;
  if (incoming_window != (uint32_t *)0x0 && session != (SESSION_HANDLE)0x0) {
    *incoming_window = session->incoming_window;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int session_get_incoming_window(SESSION_HANDLE session, uint32_t* incoming_window)
{
    int result;

    if ((session == NULL) ||
        (incoming_window == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;

        *incoming_window = session_instance->incoming_window;

        result = 0;
    }

    return result;
}